

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O2

void write_mods(ang_file *fff,int *values)

{
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  char buf [1024];
  char local_438 [1032];
  
  memset(local_438,0,0x400);
  iVar4 = 0;
  for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 8) {
    if (*values != 0) {
      if (local_438[0] != '\0') {
        my_strcat(local_438," | ",0x400);
        iVar4 = iVar4 + 3;
      }
      pcVar2 = *(char **)((long)write_mods::obj_mods + lVar3);
      my_strcat(local_438,pcVar2,0x400);
      sVar1 = strlen(pcVar2);
      pcVar2 = format("[%d]",(ulong)(uint)*values);
      my_strcat(local_438,pcVar2,0x400);
      if ((int)sVar1 + iVar4 < 0x37) {
        iVar4 = iVar4 + (int)sVar1 + 5;
      }
      else {
        iVar4 = 0;
        file_putf(fff,"%s%s\n","values:",local_438);
        my_strcpy(local_438,"",0x400);
      }
    }
    values = (int *)((uint *)values + 1);
  }
  if (iVar4 != 0) {
    file_putf(fff,"%s%s\n","values:",local_438);
  }
  return;
}

Assistant:

void write_mods(ang_file *fff, const int values[])
{
	size_t i;
	char buf[1024] = "";
	int pointer = 0;

	static const char *obj_mods[] = {
		#define STAT(a) #a,
		#include "list-stats.h"
		#undef STAT
		#define OBJ_MOD(a) #a,
		#include "list-object-modifiers.h"
		#undef OBJ_MOD
		NULL
	};

	/* Write value list */
	for (i = 0; i < OBJ_MOD_MAX; i++) {
		/* If no value, don't write */
		if (values[i] == 0) continue;

		/* If this line contains something, write a divider */
		if (strlen(buf)) {
			my_strcat(buf, " | ", sizeof(buf));
			pointer += 3;
		}

		/* Write the name and value */
		my_strcat(buf, obj_mods[i], sizeof(buf));
		pointer += strlen(obj_mods[i]);
		my_strcat(buf, format("[%d]", values[i]), sizeof(buf));
		pointer += 5;

		/* Move to a new line if this one is long enough */
		if (pointer >= 60) {
			file_putf(fff, "%s%s\n", "values:", buf);
			my_strcpy(buf, "", sizeof(buf));
			pointer = 0;
		}
	}

	/* Print remaining values if any */
	if (pointer)
		file_putf(fff, "%s%s\n", "values:", buf);
}